

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O1

string * __thiscall JFSON::esc_abi_cxx11_(string *__return_storage_ptr__,JFSON *this,char c)

{
  size_t sVar1;
  char buf [12];
  char local_1c [12];
  
  if ((char)this < ' ') {
    snprintf(local_1c,0xc,"(%d)",(ulong)(uint)(int)(char)this);
  }
  else {
    snprintf(local_1c,0xc,"\'%c\' (%d)",(ulong)this & 0xff,(ulong)this & 0xff);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_1c);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_1c,local_1c + sVar1);
  return __return_storage_ptr__;
}

Assistant:

static inline string esc(char c) {
    char buf[12];
    if (static_cast<uint8_t>(c) >= 0x20 && static_cast<uint8_t>(c) <= 0x7f) {
        snprintf(buf, sizeof buf, "'%c' (%d)", c, c);
    } else {
        snprintf(buf, sizeof buf, "(%d)", c);
    }
    return string(buf);
}